

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

treeNode * forStmt(void)

{
  bool bVar1;
  treeNode *this;
  treeNode *ptVar2;
  treeNode *ptVar3;
  treeNode *extraout_RAX;
  double __x;
  allocator local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  this = (treeNode *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_38,"",&local_f9);
  treeNode::treeNode(this,forRpt,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  ptVar2 = (treeNode *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_58,"forExp",&local_f9);
  treeNode::treeNode(ptVar2,forRpt,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  this->child[0] = ptVar2;
  std::__cxx11::string::string((string *)&local_78,"for",&local_f9);
  match(&local_78,Empty);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_98,"(",&local_f9);
  match(&local_98,Empty);
  std::__cxx11::string::~string((string *)&local_98);
  ptVar3 = statement();
  ptVar2->child[0] = ptVar3;
  std::__cxx11::string::string((string *)&local_b8,";",&local_f9);
  match(&local_b8,lackSem);
  std::__cxx11::string::~string((string *)&local_b8);
  bVar1 = std::operator==(&nextToken.text,";");
  if (bVar1) {
    ptVar3 = (treeNode *)0x0;
  }
  else {
    exp(__x);
    ptVar3 = extraout_RAX;
  }
  ptVar2->child[1] = ptVar3;
  std::__cxx11::string::string((string *)&local_d8,";",&local_f9);
  match(&local_d8,lackSem);
  std::__cxx11::string::~string((string *)&local_d8);
  ptVar3 = statement();
  ptVar2->child[2] = ptVar3;
  std::__cxx11::string::string((string *)&local_f8,")",&local_f9);
  match(&local_f8,lackRightBucket);
  std::__cxx11::string::~string((string *)&local_f8);
  ptVar2 = statementClosure();
  this->child[1] = ptVar2;
  return this;
}

Assistant:

treeNode* forStmt()
{
    auto ret = new treeNode(StmtKind::forRpt,"");
    auto forExp = new treeNode(StmtKind::forRpt,"forExp");
    ret->child[0]=forExp;
    match("for");
    match("(");
    forExp->child[0]=statement();
    match(";",Error::lackSem);
    forExp->child[1]=(nextToken.text==";"?nullptr:exp());
    match(";",Error::lackSem);
    forExp->child[2]=statement();
    match(")",Error::lackRightBucket);
    ret->child[1]=statementClosure();
    return ret;
}